

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

char * cs_impl::
       try_convert_and_check<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_1UL>
       ::convert(var *val)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  runtime_error *this;
  long *plVar6;
  size_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (val->mDat == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar3 = (*val->mDat->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
  }
  pcVar1 = *(char **)(puVar4 + 8);
  if (pcVar1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_00202abb:
    pbVar5 = any::const_val<std::__cxx11::string>(val);
  }
  else {
    if (*pcVar1 != '*') {
      iVar3 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (iVar3 == 0) goto LAB_00202abb;
    }
    if (val->mDat == (proxy *)0x0) {
      puVar4 = &void::typeinfo;
    }
    else {
      iVar3 = (*val->mDat->data->_vptr_baseHolder[2])();
      puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar3);
    }
    pcVar2 = _future_category;
    pcVar1 = *(char **)(puVar4 + 8);
    if (pcVar1 != _future_category) {
      if (*pcVar1 == '*') {
LAB_00202b0e:
        this = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&local_130,2);
        std::operator+(&local_b0,"Invalid Argument. At ",&local_130);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_190._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_190._M_dataplus._M_p == psVar7) {
          local_190.field_2._M_allocated_capacity = *psVar7;
          local_190.field_2._8_8_ = plVar6[3];
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        }
        else {
          local_190.field_2._M_allocated_capacity = *psVar7;
        }
        local_190._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        cxx_demangle_abi_cxx11_
                  (&local_d0,(cs_impl *)(pcVar2 + (*pcVar2 == '*')),
                   (char *)local_190._M_string_length);
        std::operator+(&local_90,&local_190,&local_d0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_170._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_170._M_dataplus._M_p == psVar7) {
          local_170.field_2._M_allocated_capacity = *psVar7;
          local_170.field_2._8_8_ = plVar6[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar7;
        }
        local_170._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        cxx_demangle_abi_cxx11_
                  (&local_f0,(cs_impl *)"cs::string",(char *)local_170._M_string_length);
        std::operator+(&local_70,&local_170,&local_f0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_150._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_150._M_dataplus._M_p == psVar7) {
          local_150.field_2._M_allocated_capacity = *psVar7;
          local_150.field_2._8_8_ = plVar6[3];
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar7;
        }
        local_150._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        any::get_type_name_abi_cxx11_(&local_110,val);
        std::operator+(&local_50,&local_150,&local_110);
        cs::runtime_error::runtime_error(this,&local_50);
        __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
      }
      iVar3 = strcmp(pcVar1,_future_category);
      if (iVar3 != 0) goto LAB_00202b0e;
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             any::const_val<char_const*>(val);
  }
  return (pbVar5->_M_dataplus)._M_p;
}

Assistant:

inline static _TargetT convert(cs::var &val)
		{
			if (val.type() == typeid(_SourceT))
				return type_convertor<_SourceT, _TargetT>::convert(convert_helper<_SourceT>::get_val(val));
			else if (val.type() == typeid(_TargetT))
				return convert_helper<_TargetT>::get_val(val);
			else
				throw cs::runtime_error("Invalid Argument. At " + std::to_string(index + 1) + ". Expected " +
				                        cxx_demangle(get_name_of_type<_TargetT>()) + ", compatible with " +
				                        cxx_demangle(get_name_of_type<_SourceT>()) + ", provided " +
				                        val.get_type_name());
		}